

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR eval_number(ly_ctx *ctx,lyxp_expr *exp,uint32_t *tok_idx,lyxp_set *set)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  lyxp_expr *ctx_00;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  longdouble in_ST0;
  int local_50 [2];
  char *endptr;
  longdouble num;
  lyxp_set *local_30;
  lyxp_set *set_local;
  uint32_t *tok_idx_local;
  lyxp_expr *exp_local;
  ly_ctx *ctx_local;
  
  local_30 = set;
  set_local = (lyxp_set *)tok_idx;
  tok_idx_local = (uint32_t *)exp;
  exp_local = (lyxp_expr *)ctx;
  if (set != (lyxp_set *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    strtold((char *)(*(long *)(tok_idx_local + 10) +
                    (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)set_local->type * 4)),
            (char **)local_50);
    _endptr = in_ST0;
    piVar4 = __errno_location();
    if (*piVar4 != 0) {
      ly_vlog((ly_ctx *)exp_local,(char *)0x0,LYVE_XPATH,
              "Unexpected XPath token \"%s\" (\"%.15s\").","Unknown",
              *(long *)(tok_idx_local + 10) +
              (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)set_local->type * 4));
      ctx_00 = exp_local;
      uVar1 = *(uint *)(*(long *)(tok_idx_local + 4) + (ulong)set_local->type * 4);
      lVar3 = *(long *)(tok_idx_local + 10);
      uVar2 = *(uint *)(*(long *)(tok_idx_local + 2) + (ulong)set_local->type * 4);
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      ly_vlog((ly_ctx *)ctx_00,(char *)0x0,LYVE_XPATH,
              "Failed to convert \"%.*s\" into a long double (%s).",(ulong)uVar1,
              lVar3 + (ulong)uVar2,pcVar5);
      return LY_EVALID;
    }
    if (local_50[0] -
        ((int)*(undefined8 *)(tok_idx_local + 10) +
        *(int *)(*(long *)(tok_idx_local + 2) + (ulong)set_local->type * 4)) !=
        *(int *)(*(long *)(tok_idx_local + 4) + (ulong)set_local->type * 4)) {
      ly_vlog((ly_ctx *)exp_local,(char *)0x0,LYVE_XPATH,
              "Unexpected XPath token \"%s\" (\"%.15s\").","Unknown",
              *(long *)(tok_idx_local + 10) +
              (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)set_local->type * 4));
      ly_vlog((ly_ctx *)exp_local,(char *)0x0,LYVE_XPATH,
              "Failed to convert \"%.*s\" into a long double.",
              (ulong)*(uint *)(*(long *)(tok_idx_local + 4) + (ulong)set_local->type * 4),
              *(long *)(tok_idx_local + 10) +
              (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)set_local->type * 4));
      return LY_EVALID;
    }
    set_fill_number(local_30,_endptr);
  }
  pcVar5 = "skipped";
  if (local_30 != (lyxp_set *)0x0) {
    pcVar5 = "parsed";
  }
  pcVar6 = lyxp_token2str(*(lyxp_token *)(*(long *)tok_idx_local + (ulong)set_local->type * 4));
  ly_log_dbg(2,"%-27s %s %s[%u]","eval_number",pcVar5,pcVar6,
             (ulong)*(uint *)(*(long *)(tok_idx_local + 2) + (ulong)set_local->type * 4));
  set_local->type = set_local->type + LYXP_SET_SCNODE_SET;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
eval_number(struct ly_ctx *ctx, const struct lyxp_expr *exp, uint32_t *tok_idx, struct lyxp_set *set)
{
    long double num;
    char *endptr;

    if (set) {
        errno = 0;
        num = strtold(&exp->expr[exp->tok_pos[*tok_idx]], &endptr);
        if (errno) {
            LOGVAL(ctx, LY_VCODE_XP_INTOK, "Unknown", &exp->expr[exp->tok_pos[*tok_idx]]);
            LOGVAL(ctx, LYVE_XPATH, "Failed to convert \"%.*s\" into a long double (%s).",
                    (int)exp->tok_len[*tok_idx], &exp->expr[exp->tok_pos[*tok_idx]], strerror(errno));
            return LY_EVALID;
        } else if ((uint32_t)(endptr - &exp->expr[exp->tok_pos[*tok_idx]]) != exp->tok_len[*tok_idx]) {
            LOGVAL(ctx, LY_VCODE_XP_INTOK, "Unknown", &exp->expr[exp->tok_pos[*tok_idx]]);
            LOGVAL(ctx, LYVE_XPATH, "Failed to convert \"%.*s\" into a long double.",
                    (int)exp->tok_len[*tok_idx], &exp->expr[exp->tok_pos[*tok_idx]]);
            return LY_EVALID;
        }

        set_fill_number(set, num);
    }

    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
            lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
    ++(*tok_idx);
    return LY_SUCCESS;
}